

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

domain_manager * __thiscall
cs::domain_manager::add_var_global<char_const(&)[10]>
          (domain_manager *this,char (*name) [10],var *var)

{
  byte bVar1;
  undefined8 uVar2;
  domain_type *in_RSI;
  domain_manager *in_RDI;
  string *in_stack_fffffffffffffec8;
  domain_manager *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined7 in_stack_ffffffffffffff00;
  allocator local_d9;
  string local_d8 [38];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [119];
  allocator local_39;
  string local_38 [40];
  domain_type *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)in_RSI,&local_39);
  bVar1 = var_exist_global(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if ((bVar1 & 1) == 0) {
    stack_type<cs::domain_type,_std::allocator>::bottom
              ((stack_type<cs::domain_type,_std::allocator> *)in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,(char *)local_10,&local_d9);
    domain_type::add_var(in_RSI,(string *)in_RDI,(var *)CONCAT17(bVar1,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    return in_RDI;
  }
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,(char *)local_10,&local_b1);
  std::operator+((char *)in_stack_fffffffffffffed8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  runtime_error::runtime_error((runtime_error *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8)
  ;
  local_b2 = 0;
  __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

domain_manager &add_var_global(T &&name, const var &var)
		{
			if (var_exist_global(name))
				throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			else
				m_data.bottom().add_var(name, var);
			return *this;
		}